

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTiming.cc
# Opt level: O2

int main(void)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  int iVar4;
  bool bVar5;
  initializer_list<int> __l;
  initializer_list<double> __l_00;
  bool local_309;
  vector<double,_std::allocator<double>_> x;
  OutputFunction local_2e0 [2];
  code *local_2d8 [2];
  code *local_2c8;
  code *local_2c0;
  _Vector_base<double,_std::allocator<double>_> local_2b8;
  code *local_2a0 [2];
  code *local_290;
  code *local_288;
  vector<int,_std::allocator<int>_> arch;
  _Vector_base<double,_std::allocator<double>_> local_268;
  _Vector_base<double,_std::allocator<double>_> local_250;
  FeedForwardNN<double> nn;
  
  nn._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x500000003;
  nn._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x300000005;
  __l._M_len = 4;
  __l._M_array = (iterator)&nn;
  std::vector<int,_std::allocator<int>_>::vector(&arch,__l,(allocator_type *)&x);
  local_2e0[1] = 0;
  local_2e0[0] = ACTIVATION;
  local_309 = true;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8[1] = (code *)0x0;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8[0] = nnad::Sigmoid<double>;
  local_2c0 = std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::_M_invoke
  ;
  local_2c8 = std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
              _M_manager;
  local_2a0[1] = (code *)0x0;
  local_2a0[0] = nnad::dSigmoid<double>;
  local_288 = std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::_M_invoke
  ;
  local_290 = std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
              _M_manager;
  nnad::FeedForwardNN<double>::FeedForwardNN
            (&nn,&arch,(int *)(local_2e0 + 1),&local_309,
             (function<double_(const_double_&)> *)local_2d8,
             (function<double_(const_double_&)> *)local_2a0,local_2e0,(Preprocessing *)&x,
             (vector<double,_std::allocator<double>_> *)&local_2b8);
  std::_Function_base::~_Function_base((_Function_base *)local_2a0);
  std::_Function_base::~_Function_base((_Function_base *)local_2d8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_2b8);
  std::_Function_base::~_Function_base((_Function_base *)&x);
  local_2d8[0] = (code *)0x3fb999999999999a;
  local_2d8[1] = (code *)0x4002666666666666;
  local_2c8 = (_Manager_type)0x4012000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_2d8;
  std::vector<double,_std::allocator<double>_>::vector(&x,__l_00,(allocator_type *)local_2a0);
  iVar4 = 500000;
  lVar1 = std::chrono::_V2::steady_clock::now();
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    nnad::FeedForwardNN<double>::Evaluate
              ((vector<double,_std::allocator<double>_> *)&local_250,&nn,&x);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_250);
  }
  lVar2 = std::chrono::_V2::steady_clock::now();
  poVar3 = std::operator<<((ostream *)&std::cout,"Time elepsed taken for ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,500000);
  std::operator<<(poVar3," evaluations of the NN: ");
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) / 1000000000.0);
  poVar3 = std::operator<<(poVar3," seconds");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar4 = 500000;
  lVar1 = std::chrono::_V2::steady_clock::now();
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    nnad::FeedForwardNN<double>::Derive
              ((vector<double,_std::allocator<double>_> *)&local_268,&nn,&x);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_268);
  }
  lVar2 = std::chrono::_V2::steady_clock::now();
  poVar3 = std::operator<<((ostream *)&std::cout,"Time elepsed taken for ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,500000);
  std::operator<<(poVar3," evaluations of the NN and its derivatives: ");
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) / 1000000000.0);
  poVar3 = std::operator<<(poVar3," seconds\n");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x.super__Vector_base<double,_std::allocator<double>_>);
  nnad::FeedForwardNN<double>::~FeedForwardNN(&nn);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&arch.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main()
{
  // Define architecture
  const std::vector<int> arch{3, 5, 5, 3};

  // Initialise NN
  const nnad::FeedForwardNN<double> nn{arch, 0, nnad::OutputFunction::ACTIVATION, true};

  // Input vector
  std::vector<double> x{0.1, 2.3, 4.5};

  // Number of calls
  const int ncalls = 500000;

  // Start timer
  auto start{std::chrono::steady_clock::now()};

  // Get NN at x
  for (int i = 0; i < ncalls; i++)
    nn.Evaluate(x);

  // Stop timer
  std::chrono::duration<double> elapsed_seconds{std::chrono::steady_clock::now() - start};

  // Report time
  std::cout << "Time elepsed taken for " << ncalls << " evaluations of the NN: " << elapsed_seconds.count() << " seconds" << std::endl;

  // Start timer
  start = std::chrono::steady_clock::now();

  // Compare NN derivatives at x
  for (int i = 0; i < ncalls; i++)
    nn.Derive(x);

  // Stop timer
  elapsed_seconds = std::chrono::steady_clock::now() - start;

  // Report time
  std::cout << "Time elepsed taken for " << ncalls << " evaluations of the NN and its derivatives: " << elapsed_seconds.count() << " seconds\n" << std::endl;

  return 0;
}